

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

double gettime_user_sys(void)

{
  undefined8 local_38;
  timeval result;
  timeval result_sys;
  timeval result_user;
  
  result_sys.tv_usec = stopclock.ru_utime.tv_sec - startclock.ru_utime.tv_sec;
  result_user.tv_sec = stopclock.ru_utime.tv_usec - startclock.ru_utime.tv_usec;
  if (result_user.tv_sec < 0) {
    result_sys.tv_usec = result_sys.tv_usec + -1;
    result_user.tv_sec = result_user.tv_sec + 1000000;
  }
  result.tv_usec = stopclock.ru_stime.tv_sec - startclock.ru_stime.tv_sec;
  result_sys.tv_sec = stopclock.ru_stime.tv_usec - startclock.ru_stime.tv_usec;
  if (result_sys.tv_sec < 0) {
    result.tv_usec = result.tv_usec + -1;
    result_sys.tv_sec = result_sys.tv_sec + 1000000;
  }
  local_38 = result_sys.tv_usec + result.tv_usec;
  result.tv_sec = result_user.tv_sec + result_sys.tv_sec;
  if (999999 < result.tv_sec) {
    local_38 = local_38 + 1;
    result.tv_sec = result.tv_sec + -1000000;
  }
  return (double)(local_38 * 1000) + (double)result.tv_sec / 1000.0;
}

Assistant:

double gettime_user_sys(void)
{
	struct timeval result_user;
	struct timeval result_sys;
	struct timeval result;
	timersub(&stopclock.ru_utime, &startclock.ru_utime, &result_user);
	timersub(&stopclock.ru_stime, &startclock.ru_stime, &result_sys);
	timeradd(&result_user, &result_sys, &result);
	return (double)(result.tv_sec*1000)+(double)(result.tv_usec)/1e3;
}